

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerBorderColorCase::test
          (SamplerBorderColorCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TestLog *pTVar1;
  QueryType QVar2;
  GLenum GVar3;
  ScopedLogSection *this_00;
  ScopedLogSection section;
  ScopedLogSection section_3;
  ScopedLogSection section_1;
  allocator<char> local_109;
  string local_108;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ScopedLogSection local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  ScopedLogSection local_58;
  GLenum local_50;
  Vec4 local_48;
  IVec4 local_38;
  
  QVar2 = (this->super_SamplerTest).m_type;
  if ((QVar2 & ~QUERY_BOOLEAN_VEC4) == QUERY_SAMPLER_PARAM_INTEGER_VEC4) {
    pTVar1 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Initial",(allocator<char> *)&local_98);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Initial",(allocator<char> *)&local_78);
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)&local_c0,pTVar1,&local_108,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_108);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    StateQueryUtil::verifyStateSamplerParamFloatVec4
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (Vec4 *)&local_108,(this->super_SamplerTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_c0);
    QVar2 = (this->super_SamplerTest).m_type;
  }
  if (QVar2 == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4) {
    pTVar1 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Set",(allocator<char> *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Set",(allocator<char> *)&local_98);
    tcu::ScopedLogSection::ScopedLogSection(&local_58,pTVar1,&local_108,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_108);
    local_48.m_data[0] = 3.85186e-34;
    local_48.m_data[1] = 2.8026e-45;
    local_48.m_data[2] = 4.2039e-45;
    local_48.m_data[3] = 1.79366e-43;
    glu::CallLogWrapper::glSamplerParameterIuiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (GLuint *)&local_48);
    GVar3 = glu::CallLogWrapper::glGetError(gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",(allocator<char> *)&local_a0);
      local_38.m_data._0_8_ = glu::getErrorName;
      local_38.m_data[2] = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_38);
      std::operator+(&local_c0,&local_98,&local_78);
      std::operator+(&local_e0,&local_c0,": ");
      std::operator+(&local_108,&local_e0,"glSamplerParameterIuiv");
      tcu::ResultCollector::fail(result,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateSamplerParamUnsignedIntegerVec4
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (UVec4 *)&local_48,(this->super_SamplerTest).m_type);
  }
  else {
    if (QVar2 != QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4) {
      pTVar1 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Set",(allocator<char> *)&local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"Set",(allocator<char> *)&local_98);
      tcu::ScopedLogSection::ScopedLogSection(&local_a0,pTVar1,&local_108,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_108);
      local_48.m_data[0] = 0.25;
      local_48.m_data[1] = 1.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 0.77;
      local_38.m_data._0_8_ = (code *)0x7fffffff08000000;
      local_38.m_data[2] = 0;
      local_38.m_data[3] = 0xfffffff;
      glu::CallLogWrapper::glSamplerParameterfv
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 local_48.m_data);
      GVar3 = glu::CallLogWrapper::glGetError(gl);
      if (GVar3 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Got Error ",&local_109);
        local_58.m_log = (TestLog *)glu::getErrorName;
        local_50 = GVar3;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_58);
        std::operator+(&local_c0,&local_98,&local_78);
        std::operator+(&local_e0,&local_c0,": ");
        std::operator+(&local_108,&local_e0,"glSamplerParameterfv");
        tcu::ResultCollector::fail(result,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
      }
      StateQueryUtil::verifyStateSamplerParamFloatVec4
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 &local_48,(this->super_SamplerTest).m_type);
      glu::CallLogWrapper::glSamplerParameteriv
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 local_38.m_data);
      GVar3 = glu::CallLogWrapper::glGetError(gl);
      if (GVar3 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Got Error ",&local_109);
        local_58.m_log = (TestLog *)glu::getErrorName;
        local_50 = GVar3;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_58);
        std::operator+(&local_c0,&local_98,&local_78);
        std::operator+(&local_e0,&local_c0,": ");
        std::operator+(&local_108,&local_e0,"glSamplerParameteriv");
        tcu::ResultCollector::fail(result,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_98);
      }
      StateQueryUtil::verifyStateSamplerParamNormalizedI32Vec4
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 &local_38,(this->super_SamplerTest).m_type);
      this_00 = &local_a0;
      goto LAB_008457e9;
    }
    pTVar1 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,"Set",(allocator<char> *)&local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Set",(allocator<char> *)&local_98);
    tcu::ScopedLogSection::ScopedLogSection(&local_58,pTVar1,&local_108,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_108);
    local_48.m_data[0] = NAN;
    local_48.m_data[1] = -NAN;
    local_48.m_data[2] = 4.2039e-45;
    local_48.m_data[3] = -NAN;
    glu::CallLogWrapper::glSamplerParameterIiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (GLint *)&local_48);
    GVar3 = glu::CallLogWrapper::glGetError(gl);
    if (GVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Got Error ",(allocator<char> *)&local_a0);
      local_38.m_data._0_8_ = glu::getErrorName;
      local_38.m_data[2] = GVar3;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_78,&local_38);
      std::operator+(&local_c0,&local_98,&local_78);
      std::operator+(&local_e0,&local_c0,": ");
      std::operator+(&local_108,&local_e0,"glSamplerParameterIiv");
      tcu::ResultCollector::fail(result,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
    }
    StateQueryUtil::verifyStateSamplerParamIntegerVec4
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (IVec4 *)&local_48,(this->super_SamplerTest).m_type);
  }
  this_00 = &local_58;
LAB_008457e9:
  tcu::ScopedLogSection::~ScopedLogSection(this_00);
  return;
}

Assistant:

void SamplerBorderColorCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	// border color is undefined if queried with pure type and was not set to pure value
	if (m_type == QUERY_SAMPLER_PARAM_INTEGER_VEC4 || m_type == QUERY_SAMPLER_PARAM_FLOAT_VEC4)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamFloatVec4(result, gl, m_target, m_pname, tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), m_type);
	}

	if (m_type == QUERY_SAMPLER_PARAM_PURE_INTEGER_VEC4)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::IVec4			color			(0x7FFFFFFF, -2, 3, -128);

		gl.glSamplerParameterIiv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");

		verifyStateSamplerParamIntegerVec4(result, gl, m_target, m_pname, color, m_type);
	}
	else if (m_type == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER_VEC4)
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::UVec4			color			(0x8000000ul, 2, 3, 128);

		gl.glSamplerParameterIuiv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");

		verifyStateSamplerParamUnsignedIntegerVec4(result, gl, m_target, m_pname, color, m_type);
	}
	else
	{
		DE_ASSERT(m_type == QUERY_SAMPLER_PARAM_INTEGER_VEC4 || m_type == QUERY_SAMPLER_PARAM_FLOAT_VEC4);

		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const tcu::Vec4				color			(0.25f, 1.0f, 0.0f, 0.77f);
		const tcu::IVec4			icolor			(0x8000000ul, 0x7FFFFFFF, 0, 0x0FFFFFFF);

		gl.glSamplerParameterfv(m_target, m_pname, color.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterfv");

		verifyStateSamplerParamFloatVec4(result, gl, m_target, m_pname, color, m_type);

		gl.glSamplerParameteriv(m_target, m_pname, icolor.getPtr());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteriv");

		verifyStateSamplerParamNormalizedI32Vec4(result, gl, m_target, m_pname, icolor, m_type);
	}
}